

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::New
          (Recycler *recycler,int initialCapacity,uint16 inlineSlotCapacity,
          uint16 offsetOfInlineSlots,bool isLocked,bool isShared)

{
  Recycler *pRVar1;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this;
  TrackAllocData local_48;
  byte local_1a;
  byte local_19;
  uint16 local_18;
  uint16 local_16;
  bool isShared_local;
  int iStack_14;
  bool isLocked_local;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  int initialCapacity_local;
  Recycler *recycler_local;
  
  local_1a = isShared;
  local_19 = isLocked;
  local_18 = offsetOfInlineSlots;
  local_16 = inlineSlotCapacity;
  iStack_14 = initialCapacity;
  _offsetOfInlineSlots_local = recycler;
  PropertyIndexRangesBase<Js::PropertyIndexRanges<int>_>::VerifySlotCapacity(initialCapacity);
  pRVar1 = _offsetOfInlineSlots_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,
             (type_info *)
             &SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
             ,0xf3);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *)
         new<Memory::Recycler>(0x30,pRVar1,0x43c4b0);
  SimpleDictionaryTypeHandlerBase
            (this,_offsetOfInlineSlots_local,iStack_14,local_16,local_18,(bool)(local_19 & 1),
             (bool)(local_1a & 1));
  return this;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> * SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::New(Recycler * recycler, int initialCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared)
    {
        PropertyIndexRangesType::VerifySlotCapacity(initialCapacity);
        return RecyclerNew(recycler, SimpleDictionaryTypeHandlerBase, recycler, initialCapacity, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared);
    }